

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_op.cc
# Opt level: O0

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::OpRopAnd::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,OpRopAnd *this)

{
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  SingleMthdTest *this_00;
  result_type rVar1;
  MthdNotify *this_01;
  MthdDmaNotify *this_02;
  MthdMissing *this_03;
  allocator<hwtest::pgraph::SingleMthdTest_*> local_f3;
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [38];
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [38];
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [38];
  undefined1 local_7a;
  allocator local_79;
  string local_78 [48];
  SingleMthdTest *local_48;
  MthdNotify *local_40;
  MthdDmaNotify *local_38;
  MthdMissing *local_30;
  iterator local_28;
  size_type local_20;
  OpRopAnd *local_18;
  OpRopAnd *this_local;
  
  local_18 = this;
  this_local = (OpRopAnd *)__return_storage_ptr__;
  this_00 = (SingleMthdTest *)operator_new(0x25950);
  local_7a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"nop",&local_79);
  MthdNop::SingleMthdTest
            ((MthdNop *)this_00,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_78,-1,
             (this->super_Class).cls,0x100,1,4);
  local_7a = 0;
  local_48 = this_00;
  this_01 = (MthdNotify *)operator_new(0x25950);
  local_a2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"notify",&local_a1);
  MthdNotify::SingleMthdTest
            (this_01,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_a0,0,
             (this->super_Class).cls,0x104,1,4);
  local_a2 = 0;
  local_40 = this_01;
  this_02 = (MthdDmaNotify *)operator_new(0x25950);
  local_ca = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"dma_notify",&local_c9);
  MthdDmaNotify::SingleMthdTest
            (this_02,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_c8,1,
             (this->super_Class).cls,0x180,1,4);
  local_ca = 0;
  local_38 = this_02;
  this_03 = (MthdMissing *)operator_new(0x25950);
  local_f2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"missing",&local_f1);
  MthdMissing::SingleMthdTest
            (this_03,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_f0,-1,
             (this->super_Class).cls,0x200,3,4);
  local_f2 = 0;
  local_28 = &local_48;
  local_20 = 4;
  local_30 = this_03;
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::allocator(&local_f3);
  __l._M_len = local_20;
  __l._M_array = local_28;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(__return_storage_ptr__,__l,&local_f3);
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::~allocator(&local_f3);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  return __return_storage_ptr__;
}

Assistant:

std::vector<SingleMthdTest *> OpRopAnd::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdMissing(opt, rnd(), "missing", -1, cls, 0x200, 3),
	};
}